

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvelopeForm.cpp
# Opt level: O2

void __thiscall EnvelopeForm::updateEnvelope(EnvelopeForm *this)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  
  if (this->mIgnoreChanges == false) {
    bVar1 = this->mEnvelope;
    cVar2 = QSpinBox::value();
    cVar3 = QAbstractButton::isChecked();
    bVar4 = QSpinBox::value();
    bVar4 = bVar4 | cVar2 << 4 | cVar3 << 3;
    this->mEnvelope = bVar4;
    if (bVar1 != bVar4) {
      envelopeChanged(this,bVar4);
      return;
    }
  }
  return;
}

Assistant:

void EnvelopeForm::updateEnvelope() {

    if (!mIgnoreChanges) {
        uint8_t oldValue = mEnvelope;
        mEnvelope = static_cast<uint8_t>(mInitVolumeSpin.value()) << 4 |
            static_cast<uint8_t>(mIncreasingCheckbox.isChecked() ? 0x8 : 0x0) |
            static_cast<uint8_t>(mPeriodSpin.value());
        if (oldValue != mEnvelope) {
            emit envelopeChanged(mEnvelope);
        }
    }
}